

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-debug.cpp
# Opt level: O3

void wasm::Debug::writeDWARFSections(Module *wasm,BinaryLocations *newLocations)

{
  __node_base_ptr *this;
  pointer *this_00;
  OldToNew *pOVar1;
  LineNumberOps LVar2;
  Tag TVar3;
  short sVar4;
  LineNumberExtendedOps LVar5;
  pointer pLVar6;
  __buckets_ptr pp_Var7;
  __node_base_ptr p_Var8;
  _Hash_node_base *p_Var9;
  pointer puVar10;
  OldToNew this_01;
  pointer pDVar11;
  void *pvVar12;
  pointer pCVar13;
  void *pvVar14;
  mapped_type mVar15;
  pointer pLVar16;
  pointer pLVar17;
  pointer puVar18;
  pointer puVar19;
  unique_ptr<llvm::DWARFContext,_std::default_delete<llvm::DWARFContext>_> uVar20;
  bool bVar21;
  uint uVar22;
  uint uVar23;
  BinaryLocation BVar24;
  ulong uVar25;
  iterator iVar26;
  mapped_type *pmVar27;
  mapped_type *pmVar28;
  mapped_type *pmVar29;
  Hex64 HVar30;
  Hex64 HVar31;
  pointer pEVar32;
  pointer pAVar33;
  OldToNew this_02;
  BinaryLocation BVar34;
  pointer pDVar35;
  pointer pRVar36;
  char *pcVar37;
  long lVar38;
  long lVar39;
  pointer pCVar40;
  undefined4 uVar41;
  BinaryLocation BVar42;
  undefined8 uVar43;
  int iVar44;
  ptrdiff_t _Num;
  size_type __new_size;
  byte bVar45;
  LineTable *table;
  ulong uVar46;
  pointer pUVar47;
  pointer pUVar48;
  pointer pLVar49;
  pointer pUVar50;
  bool bVar51;
  error_code eVar52;
  pair<llvm::StringMapIterator<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>,_bool>
  pVar53;
  StringRef SVar54;
  string_view s;
  undefined1 local_658 [8];
  Data data;
  LocationUpdater locationUpdater;
  StringMap<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_llvm::MallocAllocator>
  newSections;
  __node_base a_Stack_2c8 [44];
  undefined1 local_168 [8];
  BinaryenDWARFInfo info;
  mapped_type local_118;
  OldToNew *local_108;
  vector<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
  local_f8;
  LineState local_d8;
  uint uStack_b8;
  uint32_t uStack_b4;
  BinaryLocation newAddr;
  undefined8 local_a8;
  undefined8 uStack_a0;
  ulong local_90;
  pointer puStack_88;
  vector<unsigned_int,_std::allocator<unsigned_int>_> newAddrs;
  undefined1 auStack_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> llvmName;
  
  BinaryenDWARFInfo::BinaryenDWARFInfo((BinaryenDWARFInfo *)local_168,wasm);
  data.PubNames.UnitOffset._0_1_ = 0;
  data.PubNames.UnitSize = 0;
  data.PubNames.IsGNUStyle = false;
  data.PubNames._29_3_ = 0;
  data.PubNames.Entries.
  super__Vector_base<llvm::DWARFYAML::PubEntry,_std::allocator<llvm::DWARFYAML::PubEntry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  data.PubNames.Entries.
  super__Vector_base<llvm::DWARFYAML::PubEntry,_std::allocator<llvm::DWARFYAML::PubEntry>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  data.PubTypes.UnitOffset._0_1_ = 0;
  data.PubTypes.UnitSize = 0;
  data.PubTypes.IsGNUStyle = false;
  data.PubTypes._29_3_ = 0;
  data.PubTypes.Entries.
  super__Vector_base<llvm::DWARFYAML::PubEntry,_std::allocator<llvm::DWARFYAML::PubEntry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  data.PubTypes.Entries.
  super__Vector_base<llvm::DWARFYAML::PubEntry,_std::allocator<llvm::DWARFYAML::PubEntry>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  data.GNUPubNames.UnitOffset._0_1_ = 0;
  data.GNUPubNames.UnitSize = 0;
  data.GNUPubNames.IsGNUStyle = false;
  data.GNUPubNames._29_3_ = 0;
  data.GNUPubNames.Entries.
  super__Vector_base<llvm::DWARFYAML::PubEntry,_std::allocator<llvm::DWARFYAML::PubEntry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  data.GNUPubNames.Entries.
  super__Vector_base<llvm::DWARFYAML::PubEntry,_std::allocator<llvm::DWARFYAML::PubEntry>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  data.GNUPubTypes.UnitOffset._0_1_ = 0;
  data.IsLittleEndian = false;
  data._1_7_ = 0;
  data.AbbrevDecls.
  super__Vector_base<llvm::DWARFYAML::Abbrev,_std::allocator<llvm::DWARFYAML::Abbrev>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  data.AbbrevDecls.
  super__Vector_base<llvm::DWARFYAML::Abbrev,_std::allocator<llvm::DWARFYAML::Abbrev>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  data.AbbrevDecls.
  super__Vector_base<llvm::DWARFYAML::Abbrev,_std::allocator<llvm::DWARFYAML::Abbrev>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  data.DebugStrings.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  data.DebugStrings.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  data.DebugStrings.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  data.ARanges.super__Vector_base<llvm::DWARFYAML::ARange,_std::allocator<llvm::DWARFYAML::ARange>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  data.ARanges.super__Vector_base<llvm::DWARFYAML::ARange,_std::allocator<llvm::DWARFYAML::ARange>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  data.ARanges.super__Vector_base<llvm::DWARFYAML::ARange,_std::allocator<llvm::DWARFYAML::ARange>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  data.Ranges.super__Vector_base<llvm::DWARFYAML::Range,_std::allocator<llvm::DWARFYAML::Range>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  data.Ranges.super__Vector_base<llvm::DWARFYAML::Range,_std::allocator<llvm::DWARFYAML::Range>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  data.Ranges.super__Vector_base<llvm::DWARFYAML::Range,_std::allocator<llvm::DWARFYAML::Range>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  data.Locs.super__Vector_base<llvm::DWARFYAML::Loc,_std::allocator<llvm::DWARFYAML::Loc>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  data.Locs.super__Vector_base<llvm::DWARFYAML::Loc,_std::allocator<llvm::DWARFYAML::Loc>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  data.DebugLines.
  super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  data.CompileUnits.
  super__Vector_base<llvm::DWARFYAML::Unit,_std::allocator<llvm::DWARFYAML::Unit>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  data.DebugLines.
  super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  data.CompileUnits.
  super__Vector_base<llvm::DWARFYAML::Unit,_std::allocator<llvm::DWARFYAML::Unit>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  data.CompileUnits.
  super__Vector_base<llvm::DWARFYAML::Unit,_std::allocator<llvm::DWARFYAML::Unit>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  data.GNUPubTypes.Entries.
  super__Vector_base<llvm::DWARFYAML::PubEntry,_std::allocator<llvm::DWARFYAML::PubEntry>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  data.GNUPubTypes.Entries.
  super__Vector_base<llvm::DWARFYAML::PubEntry,_std::allocator<llvm::DWARFYAML::PubEntry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  data.GNUPubTypes.UnitSize = 0;
  data.GNUPubTypes.IsGNUStyle = false;
  data.GNUPubTypes._29_3_ = 0;
  data.GNUPubTypes.Entries.
  super__Vector_base<llvm::DWARFYAML::PubEntry,_std::allocator<llvm::DWARFYAML::PubEntry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  eVar52 = dwarf2yaml((DWARFContext *)info.sections._24_8_,(Data *)local_658);
  if (eVar52._M_value != 0) {
    Fatal::Fatal((Fatal *)&data.DebugLines.
                           super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
    Fatal::operator<<((Fatal *)&data.DebugLines.
                                super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (char (*) [30])"Failed to parse DWARF to YAML");
    Fatal::~Fatal((Fatal *)&data.DebugLines.
                            super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  LocationUpdater::LocationUpdater
            ((LocationUpdater *)
             &data.DebugLines.
              super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,wasm,newLocations);
  pLVar17 = data.DebugLines.
            super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>
            ._M_impl.super__Vector_impl_data._M_start;
  for (table = (LineTable *)
               data.CompileUnits.
               super__Vector_base<llvm::DWARFYAML::Unit,_std::allocator<llvm::DWARFYAML::Unit>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage; table != pLVar17;
      table = table + 1) {
    llvmName._M_dataplus._M_p = (char *)0x100000000;
    auStack_58 = (undefined1  [8])0x100000000;
    llvmName._M_string_length = 0;
    llvmName.field_2._M_local_buf[0] = table->DefaultIsStmt != '\0';
    llvmName.field_2._M_local_buf[1] = '\0';
    llvmName.field_2._M_local_buf[2] = '\0';
    llvmName.field_2._M_local_buf[3] = '\0';
    llvmName.field_2._M_allocated_capacity._4_4_ = 0;
    newAddrs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    puStack_88 = (pointer)0x0;
    newAddrs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    locationUpdater.compileUnitBases._M_h._M_single_bucket = a_Stack_2c8;
    newSections.super_StringMapImpl.TheTable = (StringMapEntryBase **)0x1;
    newSections.super_StringMapImpl.NumBuckets = 0;
    newSections.super_StringMapImpl.NumItems = 0;
    newSections.super_StringMapImpl.NumTombstones = 0;
    newSections.super_StringMapImpl.ItemSize = 0;
    newSections._24_4_ = 0x3f800000;
    a_Stack_2c8[0]._M_nxt = (_Hash_node_base *)0x0;
    pLVar49 = (table->Opcodes).
              super__Vector_base<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pLVar6 = (table->Opcodes).
             super__Vector_base<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pLVar49 == pLVar6) {
LAB_00c7c19c:
      local_f8.
      super__Vector_base<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
      ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
      local_f8.
      super__Vector_base<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
      local_f8.
      super__Vector_base<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
      ._M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
      local_f8.
      super__Vector_base<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
      local_f8.
      super__Vector_base<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    }
    else {
      llvmName.field_2._8_8_ = llvmName.field_2._8_8_ & 0xffffffff00000000;
      bVar45 = 0;
      do {
        LVar2 = pLVar49->Opcode;
        LVar5 = pLVar49->SubOpcode;
        bVar21 = LineState::update((LineState *)auStack_58,pLVar49,table);
        bVar45 = (LVar2 != DW_LNS_extended_op || LVar5 != DW_LNE_set_address) & bVar45;
        if (bVar21) {
          uVar25 = (ulong)(uint)auStack_58._0_4_;
          uVar41 = llvmName.field_2._8_4_;
          if ((bool)(auStack_58._0_4_ + 2 < 3 | bVar45)) {
            llvmName.field_2._M_local_buf[0] = table->DefaultIsStmt != '\0';
            llvmName._M_dataplus._M_p = (char *)0x100000000;
            auStack_58 = (undefined1  [8])0x100000000;
            llvmName._M_string_length = 0;
            llvmName.field_2._M_local_buf[1] = '\0';
            llvmName.field_2._M_local_buf[2] = '\0';
            llvmName.field_2._M_local_buf[3] = '\0';
            llvmName.field_2._M_allocated_capacity._4_4_ = llvmName.field_2._8_4_;
            bVar45 = 1;
          }
          else {
            _uStack_b8 = _uStack_b8 & 0xffffffff00000000;
            pp_Var7 = (&((locationUpdater.newLocations)->expressions)._M_h._M_buckets)
                      [uVar25 % (ulong)locationUpdater.oldExprAddrMap.startMap._M_h._M_buckets];
            if (pp_Var7 != (__buckets_ptr)0x0) {
              p_Var8 = *pp_Var7;
              uVar23 = *(uint *)&p_Var8[1]._M_nxt;
              while (auStack_58._0_4_ != uVar23) {
                p_Var8 = p_Var8->_M_nxt;
                if ((p_Var8 == (_Hash_node_base *)0x0) ||
                   (uVar23 = *(uint *)&p_Var8[1]._M_nxt,
                   (ulong)uVar23 % (ulong)locationUpdater.oldExprAddrMap.startMap._M_h._M_buckets !=
                   uVar25 % (ulong)locationUpdater.oldExprAddrMap.startMap._M_h._M_buckets))
                goto LAB_00c7bc9c;
              }
              if (p_Var8[2]._M_nxt != (_Hash_node_base *)0x0) {
                BVar24 = LocationUpdater::getNewExprStart
                                   ((LocationUpdater *)
                                    &data.DebugLines.
                                     super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                    auStack_58._0_4_);
                uVar25 = (ulong)BVar24;
                goto LAB_00c7be24;
              }
            }
LAB_00c7bc9c:
            if (locationUpdater.oldFuncAddrMap.startMap._M_h._M_single_bucket
                [uVar25 % (ulong)locationUpdater.oldFuncAddrMap.endMap._M_h._M_buckets]._M_nxt !=
                (_Hash_node_base *)0x0) {
              p_Var9 = (locationUpdater.oldFuncAddrMap.startMap._M_h._M_single_bucket
                        [uVar25 % (ulong)locationUpdater.oldFuncAddrMap.endMap._M_h._M_buckets].
                       _M_nxt)->_M_nxt;
              uVar23 = *(uint *)&p_Var9[1]._M_nxt;
              while (auStack_58._0_4_ != uVar23) {
                p_Var9 = p_Var9->_M_nxt;
                if ((p_Var9 == (_Hash_node_base *)0x0) ||
                   (uVar23 = *(uint *)&p_Var9[1]._M_nxt,
                   (ulong)uVar23 % (ulong)locationUpdater.oldFuncAddrMap.endMap._M_h._M_buckets !=
                   uVar25 % (ulong)locationUpdater.oldFuncAddrMap.endMap._M_h._M_buckets))
                goto LAB_00c7bcfc;
              }
              if (p_Var9[2]._M_nxt != (_Hash_node_base *)0x0) {
                BVar24 = LocationUpdater::getNewFuncEnd
                                   ((LocationUpdater *)
                                    &data.DebugLines.
                                     super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                    auStack_58._0_4_);
                uVar25 = (ulong)BVar24;
                goto LAB_00c7be24;
              }
            }
LAB_00c7bcfc:
            if (locationUpdater.oldExprAddrMap.delimiterMap._M_h._M_single_bucket
                [uVar25 % (ulong)locationUpdater.oldFuncAddrMap.startMap._M_h._M_buckets]._M_nxt !=
                (_Hash_node_base *)0x0) {
              p_Var9 = (locationUpdater.oldExprAddrMap.delimiterMap._M_h._M_single_bucket
                        [uVar25 % (ulong)locationUpdater.oldFuncAddrMap.startMap._M_h._M_buckets].
                       _M_nxt)->_M_nxt;
              uVar23 = *(uint *)&p_Var9[1]._M_nxt;
              while (auStack_58._0_4_ != uVar23) {
                p_Var9 = p_Var9->_M_nxt;
                if ((p_Var9 == (_Hash_node_base *)0x0) ||
                   (uVar23 = *(uint *)&p_Var9[1]._M_nxt,
                   (ulong)uVar23 % (ulong)locationUpdater.oldFuncAddrMap.startMap._M_h._M_buckets !=
                   uVar25 % (ulong)locationUpdater.oldFuncAddrMap.startMap._M_h._M_buckets))
                goto LAB_00c7bd5c;
              }
              if (p_Var9[2]._M_nxt != (_Hash_node_base *)0x0) {
                BVar24 = LocationUpdater::getNewFuncStart
                                   ((LocationUpdater *)
                                    &data.DebugLines.
                                     super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                    auStack_58._0_4_);
                uVar25 = (ulong)BVar24;
                goto LAB_00c7be24;
              }
            }
LAB_00c7bd5c:
            if (locationUpdater.oldExprAddrMap.endMap._M_h._M_single_bucket
                [uVar25 % (ulong)locationUpdater.oldExprAddrMap.delimiterMap._M_h._M_buckets]._M_nxt
                != (_Hash_node_base *)0x0) {
              p_Var9 = (locationUpdater.oldExprAddrMap.endMap._M_h._M_single_bucket
                        [uVar25 % (ulong)locationUpdater.oldExprAddrMap.delimiterMap._M_h._M_buckets
                        ]._M_nxt)->_M_nxt;
              uVar23 = *(uint *)&p_Var9[1]._M_nxt;
              while (auStack_58._0_4_ != uVar23) {
                p_Var9 = p_Var9->_M_nxt;
                if ((p_Var9 == (_Hash_node_base *)0x0) ||
                   (uVar23 = *(uint *)&p_Var9[1]._M_nxt,
                   (ulong)uVar23 %
                   (ulong)locationUpdater.oldExprAddrMap.delimiterMap._M_h._M_buckets !=
                   uVar25 % (ulong)locationUpdater.oldExprAddrMap.delimiterMap._M_h._M_buckets))
                goto LAB_00c7bdb9;
              }
              if (p_Var9[2]._M_nxt != (_Hash_node_base *)0x0) {
                BVar24 = LocationUpdater::getNewDelimiter
                                   ((LocationUpdater *)
                                    &data.DebugLines.
                                     super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                    auStack_58._0_4_);
                uVar25 = (ulong)BVar24;
                goto LAB_00c7be24;
              }
            }
LAB_00c7bdb9:
            if (locationUpdater.oldExprAddrMap.startMap._M_h._M_single_bucket
                [uVar25 % (ulong)locationUpdater.oldExprAddrMap.endMap._M_h._M_buckets]._M_nxt !=
                (_Hash_node_base *)0x0) {
              p_Var9 = (locationUpdater.oldExprAddrMap.startMap._M_h._M_single_bucket
                        [uVar25 % (ulong)locationUpdater.oldExprAddrMap.endMap._M_h._M_buckets].
                       _M_nxt)->_M_nxt;
              uVar23 = *(uint *)&p_Var9[1]._M_nxt;
joined_r0x00c7bde6:
              if (auStack_58._0_4_ != uVar23) goto LAB_00c7bde8;
              if (p_Var9[2]._M_nxt != (_Hash_node_base *)0x0) {
                BVar24 = LocationUpdater::getNewExprEnd
                                   ((LocationUpdater *)
                                    &data.DebugLines.
                                     super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                    auStack_58._0_4_);
                uVar25 = (ulong)BVar24;
LAB_00c7be24:
                uVar23 = (uint)uVar25;
                _uStack_b8 = CONCAT44(uStack_b4,uVar23);
                if (((uVar23 == 0) || (auStack_58._4_4_ == 0)) || (auStack_58._0_4_ == 0))
                goto LAB_00c7bf33;
                if (locationUpdater.compileUnitBases._M_h._M_single_bucket
                    [uVar25 % (ulong)newSections.super_StringMapImpl.TheTable]._M_nxt ==
                    (_Hash_node_base *)0x0) {
LAB_00c7be98:
                  if (newAddrs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start ==
                      newAddrs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish) {
                    std::vector<unsigned_int,std::allocator<unsigned_int>>::
                    _M_realloc_insert<unsigned_int_const&>
                              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&puStack_88,
                               (iterator)
                               newAddrs.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start,&stack0xffffffffffffff48);
                  }
                  else {
                    *newAddrs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start = uVar23;
                    newAddrs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start =
                         newAddrs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start + 1;
                  }
                  std::
                  _Hashtable<unsigned_int,std::pair<unsigned_int_const,wasm::Debug::LineState>,std::allocator<std::pair<unsigned_int_const,wasm::Debug::LineState>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  ::_M_emplace<unsigned_int&,wasm::Debug::LineState&>
                            ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,wasm::Debug::LineState>,std::allocator<std::pair<unsigned_int_const,wasm::Debug::LineState>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                              *)&locationUpdater.compileUnitBases._M_h._M_single_bucket,
                             &stack0xffffffffffffff48,auStack_58);
                  uVar25 = (_uStack_b8 & 0xffffffff) %
                           (ulong)newSections.super_StringMapImpl.TheTable;
                  if (locationUpdater.compileUnitBases._M_h._M_single_bucket[uVar25]._M_nxt ==
                      (_Hash_node_base *)0x0) {
LAB_00c7cbc1:
                    std::__throw_out_of_range("_Map_base::at");
                  }
                  p_Var9 = (locationUpdater.compileUnitBases._M_h._M_single_bucket[uVar25]._M_nxt)->
                           _M_nxt;
                  uVar23 = *(uint *)&p_Var9[1]._M_nxt;
                  while (uStack_b8 != uVar23) {
                    p_Var9 = p_Var9->_M_nxt;
                    if ((p_Var9 == (_Hash_node_base *)0x0) ||
                       (uVar23 = *(uint *)&p_Var9[1]._M_nxt,
                       (ulong)uVar23 % (ulong)newSections.super_StringMapImpl.TheTable != uVar25))
                    goto LAB_00c7cbc1;
                  }
                  *(uint *)((long)&p_Var9[1]._M_nxt + 4) = uStack_b8;
                  llvmName.field_2._M_local_buf[2] = '\0';
                  goto LAB_00c7bf33;
                }
                p_Var9 = (locationUpdater.compileUnitBases._M_h._M_single_bucket
                          [uVar25 % (ulong)newSections.super_StringMapImpl.TheTable]._M_nxt)->_M_nxt
                ;
                uVar22 = *(uint *)&p_Var9[1]._M_nxt;
                while (uVar23 != uVar22) {
                  p_Var9 = p_Var9->_M_nxt;
                  if ((p_Var9 == (_Hash_node_base *)0x0) ||
                     (uVar22 = *(uint *)&p_Var9[1]._M_nxt,
                     (ulong)uVar22 % (ulong)newSections.super_StringMapImpl.TheTable !=
                     uVar25 % (ulong)newSections.super_StringMapImpl.TheTable)) goto LAB_00c7be98;
                }
                goto LAB_00c7bf7b;
              }
            }
LAB_00c7bf33:
            if ((pLVar49->Opcode == DW_LNS_extended_op) &&
               (pLVar49->SubOpcode == DW_LNE_end_sequence)) {
              iVar44 = uVar41 + 1;
              if (iVar44 == -1) {
                __assert_fail("sequenceId != uint32_t(-1)",
                              "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-debug.cpp"
                              ,0x2d9,
                              "void wasm::Debug::updateDebugLines(llvm::DWARFYAML::Data &, LocationUpdater &)"
                             );
              }
              llvmName.field_2._M_local_buf[0] = table->DefaultIsStmt != '\0';
              llvmName._M_dataplus._M_p = (char *)0x100000000;
              auStack_58 = (undefined1  [8])0x100000000;
              llvmName._M_string_length = 0;
              llvmName.field_2._M_local_buf[1] = '\0';
              llvmName.field_2._M_local_buf[2] = '\0';
              llvmName.field_2._M_local_buf[3] = '\0';
              llvmName.field_2._8_4_ = iVar44;
              llvmName.field_2._M_allocated_capacity._4_4_ = iVar44;
            }
LAB_00c7bf7b:
            bVar45 = 0;
          }
        }
        puVar19 = newAddrs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        puVar18 = puStack_88;
        pLVar49 = pLVar49 + 1;
      } while (pLVar49 != pLVar6);
      if (puStack_88 ==
          newAddrs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_f8.
        super__Vector_base<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
        ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
        local_f8.
        super__Vector_base<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
        ._M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
        local_f8.
        super__Vector_base<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
        ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
        local_f8.
        super__Vector_base<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
        ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
        local_f8.
        super__Vector_base<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      }
      else {
        uVar25 = (long)newAddrs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start - (long)puStack_88 >> 2;
        lVar38 = 0x3f;
        if (uVar25 != 0) {
          for (; uVar25 >> lVar38 == 0; lVar38 = lVar38 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (puStack_88,
                   newAddrs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start,((uint)lVar38 ^ 0x3f) * 2 ^ 0x7e);
        this = &locationUpdater.compileUnitBases._M_h._M_single_bucket;
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (puVar18,puVar19);
        local_f8.
        super__Vector_base<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_f8.
        super__Vector_base<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_f8.
        super__Vector_base<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (newAddrs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start == puStack_88) goto LAB_00c7c19c;
        lVar38 = 4;
        uVar25 = 0;
        do {
          iVar26 = std::
                   _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Debug::LineState>,_std::allocator<std::pair<const_unsigned_int,_wasm::Debug::LineState>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Debug::LineState>,_std::allocator<std::pair<const_unsigned_int,_wasm::Debug::LineState>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           *)this,(key_type *)((long)puStack_88 + lVar38 + -4));
          if (iVar26.
              super__Node_iterator_base<std::pair<const_unsigned_int,_wasm::Debug::LineState>,_false>
              ._M_cur == (__node_type *)0x0) {
            std::__throw_out_of_range("_Map_base::at");
          }
          mVar15 = *(mapped_type *)
                    ((long)iVar26.
                           super__Node_iterator_base<std::pair<const_unsigned_int,_wasm::Debug::LineState>,_false>
                           ._M_cur + 0xc);
          _newAddr = *(undefined8 *)
                      ((long)iVar26.
                             super__Node_iterator_base<std::pair<const_unsigned_int,_wasm::Debug::LineState>,_false>
                             ._M_cur + 0x14);
          local_a8 = *(undefined8 *)
                      ((long)iVar26.
                             super__Node_iterator_base<std::pair<const_unsigned_int,_wasm::Debug::LineState>,_false>
                             ._M_cur + 0x1c);
          uStack_a0 = *(undefined8 *)
                       ((long)iVar26.
                              super__Node_iterator_base<std::pair<const_unsigned_int,_wasm::Debug::LineState>,_false>
                              ._M_cur + 0x24);
          uStack_b4 = (uint32_t)(mVar15 >> 0x20);
          _uStack_b8 = mVar15;
          if ((uStack_b4 == 0) || (uStack_b8 = (uint)mVar15, uStack_b8 == 0)) {
            __assert_fail("state.needToEmit()",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-debug.cpp"
                          ,0x2e6,
                          "void wasm::Debug::updateDebugLines(llvm::DWARFYAML::Data &, LocationUpdater &)"
                         );
          }
          local_d8.addr = 0;
          local_d8.line = 1;
          local_d8.col = 0;
          local_d8.file = 1;
          local_d8.isa = 0;
          local_d8.discriminator = 0;
          local_d8._25_3_ = 0;
          local_d8.isStmt = table->DefaultIsStmt != '\0';
          local_d8.sequenceId = 0xffffffff;
          if (uVar25 != 0) {
            iVar26 = std::
                     _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Debug::LineState>,_std::allocator<std::pair<const_unsigned_int,_wasm::Debug::LineState>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Debug::LineState>,_std::allocator<std::pair<const_unsigned_int,_wasm::Debug::LineState>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                             *)this,(key_type *)((long)puStack_88 + lVar38 + -8));
            if (iVar26.
                super__Node_iterator_base<std::pair<const_unsigned_int,_wasm::Debug::LineState>,_false>
                ._M_cur == (__node_type *)0x0) {
              std::__throw_out_of_range("_Map_base::at");
            }
            local_d8._0_8_ =
                 *(undefined8 *)
                  ((long)iVar26.
                         super__Node_iterator_base<std::pair<const_unsigned_int,_wasm::Debug::LineState>,_false>
                         ._M_cur + 0xc);
            local_d8._8_8_ =
                 *(undefined8 *)
                  ((long)iVar26.
                         super__Node_iterator_base<std::pair<const_unsigned_int,_wasm::Debug::LineState>,_false>
                         ._M_cur + 0x14);
            local_d8._16_8_ =
                 *(undefined8 *)
                  ((long)iVar26.
                         super__Node_iterator_base<std::pair<const_unsigned_int,_wasm::Debug::LineState>,_false>
                         ._M_cur + 0x1c);
            local_d8._24_8_ =
                 *(undefined8 *)
                  ((long)iVar26.
                         super__Node_iterator_base<std::pair<const_unsigned_int,_wasm::Debug::LineState>,_false>
                         ._M_cur + 0x24);
            if (local_d8.sequenceId != uStack_a0._4_4_) {
              local_d8.addr = 0;
              local_d8.line = 1;
              local_d8.col = 0;
              local_d8.file = 1;
              local_d8.isa = 0;
              local_d8.discriminator = 0;
              local_d8._25_3_ = 0;
              local_d8.isStmt = table->DefaultIsStmt != '\0';
              local_d8.sequenceId = 0xffffffff;
            }
          }
          uVar25 = uVar25 + 1;
          bVar21 = true;
          if (uVar25 != (long)newAddrs.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start - (long)puStack_88 >> 2) {
            iVar26 = std::
                     _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Debug::LineState>,_std::allocator<std::pair<const_unsigned_int,_wasm::Debug::LineState>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Debug::LineState>,_std::allocator<std::pair<const_unsigned_int,_wasm::Debug::LineState>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                             *)this,(key_type *)((long)puStack_88 + lVar38));
            if (iVar26.
                super__Node_iterator_base<std::pair<const_unsigned_int,_wasm::Debug::LineState>,_false>
                ._M_cur == (__node_type *)0x0) {
              std::__throw_out_of_range("_Map_base::at");
            }
            bVar21 = *(uint32_t *)
                      ((long)iVar26.
                             super__Node_iterator_base<std::pair<const_unsigned_int,_wasm::Debug::LineState>,_false>
                             ._M_cur + 0x28) != uStack_a0._4_4_;
          }
          LineState::emitDiff((LineState *)&stack0xffffffffffffff48,&local_d8,&local_f8,table,bVar21
                             );
          lVar38 = lVar38 + 4;
        } while (uVar25 < (ulong)((long)newAddrs.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start - (long)puStack_88
                                 >> 2));
      }
    }
    pLVar49 = (table->Opcodes).
              super__Vector_base<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (table->Opcodes).
    super__Vector_base<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_f8.
         super__Vector_base<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pLVar6 = (table->Opcodes).
             super__Vector_base<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pLVar16 = (table->Opcodes).
              super__Vector_base<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    *(undefined4 *)
     &(table->Opcodes).
      super__Vector_base<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
      ._M_impl.super__Vector_impl_data._M_start =
         local_f8.
         super__Vector_base<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
         ._M_impl.super__Vector_impl_data._M_start._0_4_;
    *(undefined4 *)
     ((long)&(table->Opcodes).
             super__Vector_base<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
             ._M_impl.super__Vector_impl_data._M_start + 4) =
         local_f8.
         super__Vector_base<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
         ._M_impl.super__Vector_impl_data._M_start._4_4_;
    *(undefined4 *)
     &(table->Opcodes).
      super__Vector_base<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
      ._M_impl.super__Vector_impl_data._M_finish =
         local_f8.
         super__Vector_base<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
         ._M_impl.super__Vector_impl_data._M_finish._0_4_;
    *(undefined4 *)
     ((long)&(table->Opcodes).
             super__Vector_base<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
             ._M_impl.super__Vector_impl_data._M_finish + 4) =
         local_f8.
         super__Vector_base<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
         ._M_impl.super__Vector_impl_data._M_finish._4_4_;
    local_f8.
    super__Vector_base<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
    ._M_impl.super__Vector_impl_data._M_start = pLVar6;
    local_f8.
    super__Vector_base<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
    ._M_impl.super__Vector_impl_data._M_finish = pLVar16;
    local_f8.
    super__Vector_base<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pLVar49;
    std::vector<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
    ::~vector(&local_f8);
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Debug::LineState>,_std::allocator<std::pair<const_unsigned_int,_wasm::Debug::LineState>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Debug::LineState>,_std::allocator<std::pair<const_unsigned_int,_wasm::Debug::LineState>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)&locationUpdater.compileUnitBases._M_h._M_single_bucket);
    if (puStack_88 != (pointer)0x0) {
      operator_delete(puStack_88,
                      (long)newAddrs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)puStack_88);
    }
  }
  locationUpdater.compileUnitBases._M_h._M_single_bucket = (__node_base_ptr)0x0;
  newSections.super_StringMapImpl.TheTable = (StringMapEntryBase **)0x0;
  newSections.super_StringMapImpl.NumBuckets = 0;
  newSections.super_StringMapImpl.NumItems = 0;
  llvm::DWARFYAML::ComputeDebugLine
            ((Data *)local_658,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             &locationUpdater.compileUnitBases._M_h._M_single_bucket);
  if (data.DebugLines.
      super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (pointer)data.CompileUnits.
               super__Vector_base<llvm::DWARFYAML::Unit,_std::allocator<llvm::DWARFYAML::Unit>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage) {
    pUVar50 = data.CompileUnits.
              super__Vector_base<llvm::DWARFYAML::Unit,_std::allocator<llvm::DWARFYAML::Unit>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
    if (locationUpdater.compileUnitBases._M_h._M_single_bucket == (__node_base_ptr)0x0)
    goto LAB_00c7c2fc;
  }
  else {
    lVar38 = 0;
    uVar46 = 0;
    uVar25 = 0;
    do {
      pUVar50 = data.CompileUnits.
                super__Vector_base<llvm::DWARFYAML::Unit,_std::allocator<llvm::DWARFYAML::Unit>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
      auStack_58._0_4_ =
           *(undefined4 *)
            ((long)&((data.CompileUnits.
                      super__Vector_base<llvm::DWARFYAML::Unit,_std::allocator<llvm::DWARFYAML::Unit>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage)->Length).TotalLength +
            lVar38);
      pmVar27 = std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&locationUpdater.locToUnitMap._M_h._M_single_bucket,
                             (key_type *)auStack_58);
      *pmVar27 = (mapped_type)uVar25;
      *(ulong *)((long)&(pUVar50->Length).TotalLength + lVar38) = uVar25;
      p_Var9 = locationUpdater.compileUnitBases._M_h._M_single_bucket[uVar46]._M_nxt;
      iVar44 = (int)p_Var9;
      if ((_Hash_node_base *)0xfffffffe < p_Var9) {
        *(_Hash_node_base **)((long)&pUVar50->Version + lVar38) = p_Var9;
        iVar44 = -1;
      }
      uVar25 = (ulong)((mapped_type)uVar25 + (int)p_Var9 + 4);
      *(int *)((long)&(pUVar50->Length).TotalLength64 + lVar38) = iVar44;
      uVar46 = uVar46 + 1;
      lVar38 = lVar38 + 0x90;
    } while (uVar46 < (ulong)(((long)data.DebugLines.
                                     super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>
                                     ._M_impl.super__Vector_impl_data._M_start -
                               (long)data.CompileUnits.
                                     super__Vector_base<llvm::DWARFYAML::Unit,_std::allocator<llvm::DWARFYAML::Unit>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage >> 4) *
                             -0x71c71c71c71c71c7));
  }
  pUVar50 = data.CompileUnits.
            super__Vector_base<llvm::DWARFYAML::Unit,_std::allocator<llvm::DWARFYAML::Unit>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage;
  operator_delete(locationUpdater.compileUnitBases._M_h._M_single_bucket,
                  newSections.super_StringMapImpl._8_8_ -
                  (long)locationUpdater.compileUnitBases._M_h._M_single_bucket);
LAB_00c7c2fc:
  uVar43 = info.sections._24_8_;
  puVar10 = (wasm->memories).
            super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((wasm->memories).
      super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish == puVar10) {
    newAddrs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 4;
  }
  else {
    newAddrs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ =
         (uint)((((puVar10->_M_t).
                  super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
                  super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                  super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl)->addressType).id == 3)
         * 4 + 4;
  }
  this_02 = (OldToNew)info.sections._24_8_;
  llvm::DWARFContext::parseNormalUnits((DWARFContext *)info.sections._24_8_);
  uVar23 = *(uint *)(uVar43 + 0x48);
  if (*(uint *)(uVar43 + 0x48) == 0xffffffff) {
    uVar23 = *(uint *)(uVar43 + 0x18);
  }
  pUVar48 = (pointer)data.GNUPubTypes.Entries.
                     super__Vector_base<llvm::DWARFYAML::PubEntry,_std::allocator<llvm::DWARFYAML::PubEntry>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
  if (uVar23 != 0) {
    local_108 = *(OldToNew **)(uVar43 + 0x10);
    pOVar1 = local_108 + uVar23;
    local_118 = 0;
    do {
      if (pUVar48 ==
          data.CompileUnits.
          super__Vector_base<llvm::DWARFYAML::Unit,_std::allocator<llvm::DWARFYAML::Unit>_>._M_impl.
          super__Vector_impl_data._M_start) {
        pcVar37 = 
        "void wasm::Debug::iterContextAndYAML(const T &, U &, W) [T = llvm::iterator_range<std::unique_ptr<llvm::DWARFUnit> *>, U = std::vector<llvm::DWARFYAML::Unit>, W = (lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-debug.cpp:889:5)]"
        ;
LAB_00c7cbb7:
        __assert_fail("yamlValue != yamlList.end()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-debug.cpp"
                      ,0x310,pcVar37);
      }
      this_01 = *local_108;
      if (newAddrs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ != pUVar48->AddrSize) {
        pUVar48->AddrSize =
             (uint8_t)newAddrs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        pUVar48->AddrSizeChanged = true;
      }
      this_02 = this_01;
      llvm::DWARFUnit::extractDIEsIfNeeded((DWARFUnit *)this_01,false);
      pDVar11 = *(pointer *)((long)this_01 + 0x1b0);
      pEVar32 = (pUVar48->Entries).
                super__Vector_base<llvm::DWARFYAML::Entry,_std::allocator<llvm::DWARFYAML::Entry>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar20 = info.context;
      for (pDVar35 = (((vector<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>
                        *)((long)this_01 + 0x1a8))->
                     super__Vector_base<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>
                     )._M_impl.super__Vector_impl_data._M_start;
          info.context._M_t.
          super___uniq_ptr_impl<llvm::DWARFContext,_std::default_delete<llvm::DWARFContext>_>._M_t.
          super__Tuple_impl<0UL,_llvm::DWARFContext_*,_std::default_delete<llvm::DWARFContext>_>.
          super__Head_base<0UL,_llvm::DWARFContext_*,_false>._M_head_impl =
               uVar20._M_t.
               super___uniq_ptr_impl<llvm::DWARFContext,_std::default_delete<llvm::DWARFContext>_>.
               _M_t.
               super__Tuple_impl<0UL,_llvm::DWARFContext_*,_std::default_delete<llvm::DWARFContext>_>
               .super__Head_base<0UL,_llvm::DWARFContext_*,_false>._M_head_impl, pDVar35 != pDVar11;
          pDVar35 = pDVar35 + 1) {
        if (pEVar32 ==
            (pUVar48->Entries).
            super__Vector_base<llvm::DWARFYAML::Entry,_std::allocator<llvm::DWARFYAML::Entry>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          pcVar37 = 
          "void wasm::Debug::iterContextAndYAML(const T &, U &, W) [T = llvm::iterator_range<__gnu_cxx::__normal_iterator<llvm::DWARFDebugInfoEntry *, std::vector<llvm::DWARFDebugInfoEntry>>>, U = std::vector<llvm::DWARFYAML::Entry>, W = (lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-debug.cpp:902:9)]"
          ;
          goto LAB_00c7cbb7;
        }
        info.context._M_t.
        super___uniq_ptr_impl<llvm::DWARFContext,_std::default_delete<llvm::DWARFContext>_>._M_t.
        super__Tuple_impl<0UL,_llvm::DWARFContext_*,_std::default_delete<llvm::DWARFContext>_>.
        super__Head_base<0UL,_llvm::DWARFContext_*,_false>._M_head_impl =
             (__uniq_ptr_data<llvm::DWARFContext,_std::default_delete<llvm::DWARFContext>,_true,_true>
              )pDVar35->AbbrevDecl;
        if ((tuple<llvm::DWARFContext_*,_std::default_delete<llvm::DWARFContext>_>)
            info.context._M_t.
            super___uniq_ptr_impl<llvm::DWARFContext,_std::default_delete<llvm::DWARFContext>_>._M_t
            .super__Tuple_impl<0UL,_llvm::DWARFContext_*,_std::default_delete<llvm::DWARFContext>_>.
            super__Head_base<0UL,_llvm::DWARFContext_*,_false>._M_head_impl !=
            (_Head_base<0UL,_llvm::DWARFContext_*,_false>)0x0) {
          _uStack_b8 = local_118;
          TVar3 = *(Tag *)((long)info.context._M_t.
                                 super___uniq_ptr_impl<llvm::DWARFContext,_std::default_delete<llvm::DWARFContext>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_llvm::DWARFContext_*,_std::default_delete<llvm::DWARFContext>_>
                                 .super__Head_base<0UL,_llvm::DWARFContext_*,_false>._M_head_impl +
                          4);
          local_90 = (ulong)TVar3;
          uVar23 = *(uint *)((long)info.context._M_t.
                                   super___uniq_ptr_impl<llvm::DWARFContext,_std::default_delete<llvm::DWARFContext>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_llvm::DWARFContext_*,_std::default_delete<llvm::DWARFContext>_>
                                   .super__Head_base<0UL,_llvm::DWARFContext_*,_false>._M_head_impl
                            + 0x10);
          pUVar50 = (pointer)(pEVar32->Values).
                             super__Vector_base<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>
                             ._M_impl.super__Vector_impl_data._M_start;
          llvmName.field_2._12_4_ = (undefined4)((ulong)llvmName.field_2._8_8_ >> 0x20);
          if ((ulong)uVar23 == 0) {
            llvmName.field_2._8_8_ = (ulong)(uint)llvmName.field_2._12_4_ << 0x20;
            BVar24 = 0;
          }
          else {
            pvVar12 = (((AttributeSpecVector *)
                       ((long)info.context._M_t.
                              super___uniq_ptr_impl<llvm::DWARFContext,_std::default_delete<llvm::DWARFContext>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_llvm::DWARFContext_*,_std::default_delete<llvm::DWARFContext>_>
                              .super__Head_base<0UL,_llvm::DWARFContext_*,_false>._M_head_impl + 8))
                      ->super_SmallVectorImpl<llvm::DWARFAbbreviationDeclaration::AttributeSpec>).
                      super_SmallVectorTemplateBase<llvm::DWARFAbbreviationDeclaration::AttributeSpec,_true>
                      .
                      super_SmallVectorTemplateCommon<llvm::DWARFAbbreviationDeclaration::AttributeSpec,_void>
                      .super_SmallVectorBase.BeginX;
            lVar38 = 0;
            llvmName.field_2._8_8_ = (ulong)(uint)llvmName.field_2._12_4_ << 0x20;
            BVar24 = 0;
            do {
              mVar15 = _uStack_b8;
              if (pUVar50 ==
                  (pointer)(pEVar32->Values).
                           super__Vector_base<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>
                           ._M_impl.super__Vector_impl_data._M_finish) {
                pcVar37 = 
                "void wasm::Debug::iterContextAndYAML(const T &, U &, W) [T = llvm::iterator_range<const llvm::DWARFAbbreviationDeclaration::AttributeSpec *>, U = std::vector<llvm::DWARFYAML::FormValue>, W = (lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-debug.cpp:807:5)]"
                ;
                goto LAB_00c7cbb7;
              }
              sVar4 = *(short *)((long)pvVar12 + lVar38);
              if (sVar4 == 2) {
                if (*(short *)((long)pvVar12 + lVar38 + 2) == 0x17) {
                  locationUpdater.compileUnitBases._M_h._M_single_bucket =
                       (__node_base_ptr)
                       CONCAT44(locationUpdater.compileUnitBases._M_h._M_single_bucket._4_4_,
                                (int)*(uint64_t *)&(pUVar50->Length).TotalLength);
                  this_02 = (OldToNew)&locationUpdater.oldFuncAddrMap.endMap._M_h._M_single_bucket;
                  pmVar29 = std::__detail::
                            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                          *)this_02,
                                         (key_type *)
                                         &locationUpdater.compileUnitBases._M_h._M_single_bucket);
                  *pmVar29 = mVar15;
                }
              }
              else {
                if (sVar4 == 0x10) {
                  this_02 = (OldToNew)
                            &data.DebugLines.
                             super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  uVar22 = LocationUpdater::getNewDebugLineLocation
                                     ((LocationUpdater *)this_02,
                                      (BinaryLocation)*(uint64_t *)&(pUVar50->Length).TotalLength);
                }
                else {
                  if (sVar4 != 0x11) goto LAB_00c7c548;
                  BVar24 = (BinaryLocation)*(uint64_t *)&(pUVar50->Length).TotalLength;
                  llvmName.field_2._8_4_ = BVar24;
                  if (TVar3 < DW_TAG_inlined_subroutine) {
                    if (1 < TVar3 - 10) {
                      if (TVar3 == DW_TAG_compile_unit) {
                        uVar22 = LocationUpdater::getNewFuncStart
                                           ((LocationUpdater *)
                                            &data.DebugLines.
                                             super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                            BVar24);
                        this_02 = (OldToNew)&locationUpdater.debugLineMap._M_h._M_single_bucket;
                        pmVar28 = std::__detail::
                                  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                                *)this_02,(key_type *)&stack0xffffffffffffff48);
                        pmVar28->first = llvmName.field_2._8_4_;
                        pmVar28->second = uVar22;
                        BVar24 = uVar22;
                        goto LAB_00c7c53e;
                      }
LAB_00c7cc6b:
                      Fatal::Fatal((Fatal *)&locationUpdater.compileUnitBases._M_h._M_single_bucket)
                      ;
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&newSections.super_StringMapImpl.NumBuckets,
                                 "unknown tag with low_pc ",0x18);
                      SVar54 = llvm::dwarf::TagString((uint)local_90);
                      pcVar37 = SVar54.Data;
                      if (pcVar37 == (char *)0x0) {
                        llvmName._M_dataplus._M_p = (char *)0x0;
                        auStack_58 = (undefined1  [8])&llvmName._M_string_length;
                        llvmName._M_string_length = llvmName._M_string_length & 0xffffffffffffff00;
                      }
                      else {
                        auStack_58 = (undefined1  [8])&llvmName._M_string_length;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)auStack_58,pcVar37,pcVar37 + SVar54.Length);
                      }
                      Fatal::operator<<((Fatal *)&locationUpdater.compileUnitBases._M_h.
                                                  _M_single_bucket,
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)auStack_58);
                      goto LAB_00c7cda2;
                    }
                  }
                  else if (TVar3 != DW_TAG_GNU_call_site) {
                    if (TVar3 == DW_TAG_subprogram) {
                      this_02 = (OldToNew)
                                &data.DebugLines.
                                 super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
                      uVar22 = LocationUpdater::getNewFuncStart((LocationUpdater *)this_02,BVar24);
                      BVar24 = uVar22;
                      goto LAB_00c7c53e;
                    }
                    if (TVar3 != DW_TAG_inlined_subroutine) goto LAB_00c7cc6b;
                  }
                  this_02 = (OldToNew)
                            &data.DebugLines.
                             super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  uVar22 = LocationUpdater::getNewStart((LocationUpdater *)this_02,BVar24);
                  BVar24 = uVar22;
                }
LAB_00c7c53e:
                HVar30.value._4_4_ = 0;
                HVar30.value._0_4_ = uVar22;
                *(uint64_t *)&pUVar50->Length = HVar30.value;
              }
LAB_00c7c548:
              pUVar50 = (pointer)&(pUVar50->Entries).
                                  super__Vector_base<llvm::DWARFYAML::Entry,_std::allocator<llvm::DWARFYAML::Entry>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
              lVar38 = lVar38 + 0x10;
            } while ((ulong)uVar23 << 4 != lVar38);
          }
          if (pUVar50 !=
              (pointer)(pEVar32->Values).
                       super__Vector_base<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>
                       ._M_impl.super__Vector_impl_data._M_finish) {
            pcVar37 = 
            "void wasm::Debug::iterContextAndYAML(const T &, U &, W) [T = llvm::iterator_range<const llvm::DWARFAbbreviationDeclaration::AttributeSpec *>, U = std::vector<llvm::DWARFYAML::FormValue>, W = (lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-debug.cpp:807:5)]"
            ;
            goto LAB_00c7cc61;
          }
          uVar23 = *(uint *)((long)info.context._M_t.
                                   super___uniq_ptr_impl<llvm::DWARFContext,_std::default_delete<llvm::DWARFContext>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_llvm::DWARFContext_*,_std::default_delete<llvm::DWARFContext>_>
                                   .super__Head_base<0UL,_llvm::DWARFContext_*,_false>._M_head_impl
                            + 0x10);
          pUVar47 = (pointer)(pEVar32->Values).
                             super__Vector_base<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>
                             ._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)uVar23 != 0) {
            lVar38 = *(long *)((long)info.context._M_t.
                                     super___uniq_ptr_impl<llvm::DWARFContext,_std::default_delete<llvm::DWARFContext>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_llvm::DWARFContext_*,_std::default_delete<llvm::DWARFContext>_>
                                     .super__Head_base<0UL,_llvm::DWARFContext_*,_false>.
                                     _M_head_impl + 8);
            lVar39 = 0;
            do {
              if (pUVar47 ==
                  (pointer)(pEVar32->Values).
                           super__Vector_base<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>
                           ._M_impl.super__Vector_impl_data._M_finish) {
                pcVar37 = 
                "void wasm::Debug::iterContextAndYAML(const T &, U &, W) [T = llvm::iterator_range<const llvm::DWARFAbbreviationDeclaration::AttributeSpec *>, U = std::vector<llvm::DWARFYAML::FormValue>, W = (lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-debug.cpp:849:5)]"
                ;
                goto LAB_00c7cbb7;
              }
              if (*(short *)(lVar38 + lVar39) == 0x12) {
                sVar4 = *(short *)(lVar38 + 2 + lVar39);
                uVar41 = llvmName.field_2._8_4_;
                if (sVar4 != 6) {
                  uVar41 = 0;
                }
                BVar42 = uVar41 + (int)*(uint64_t *)&(pUVar47->Length).TotalLength;
                if ((uint)local_90 < 0x2f) {
                  if ((0x20000c00UL >> (local_90 & 0x3f) & 1) != 0) goto LAB_00c7c61d;
                  if ((0x400000020000U >> (local_90 & 0x3f) & 1) == 0) goto LAB_00c7c612;
                  this_02 = (OldToNew)
                            &data.DebugLines.
                             super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  BVar42 = LocationUpdater::getNewFuncEnd((LocationUpdater *)this_02,BVar42);
                }
                else {
LAB_00c7c612:
                  if ((uint)local_90 != 0x4109) {
                    Fatal::Fatal((Fatal *)&locationUpdater.compileUnitBases._M_h._M_single_bucket);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&newSections.super_StringMapImpl.NumBuckets,
                               "unknown tag with low_pc ",0x18);
                    SVar54 = llvm::dwarf::TagString((uint)local_90);
                    pcVar37 = SVar54.Data;
                    if (pcVar37 == (char *)0x0) {
                      llvmName._M_dataplus._M_p = (char *)0x0;
                      auStack_58 = (undefined1  [8])&llvmName._M_string_length;
                      llvmName._M_string_length = llvmName._M_string_length & 0xffffffffffffff00;
                    }
                    else {
                      auStack_58 = (undefined1  [8])&llvmName._M_string_length;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)auStack_58,pcVar37,pcVar37 + SVar54.Length);
                    }
                    Fatal::operator<<((Fatal *)&locationUpdater.compileUnitBases._M_h.
                                                _M_single_bucket,
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)auStack_58);
LAB_00c7cda2:
                    std::__cxx11::string::~string((string *)auStack_58);
                    Fatal::~Fatal((Fatal *)&locationUpdater.compileUnitBases._M_h._M_single_bucket);
                  }
LAB_00c7c61d:
                  this_02 = (OldToNew)
                            &data.DebugLines.
                             super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  BVar42 = LocationUpdater::getNewExprEnd((LocationUpdater *)this_02,BVar42);
                }
                BVar34 = BVar24;
                if (sVar4 != 6) {
                  BVar34 = 0;
                }
                HVar31.value._0_4_ = BVar42 - BVar34;
                HVar31.value._4_4_ = 0;
                *(uint64_t *)&pUVar47->Length = HVar31.value;
              }
              pUVar47 = (pointer)&(pUVar47->Entries).
                                  super__Vector_base<llvm::DWARFYAML::Entry,_std::allocator<llvm::DWARFYAML::Entry>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
              lVar39 = lVar39 + 0x10;
            } while ((ulong)uVar23 << 4 != lVar39);
            pUVar50 = (pointer)(pEVar32->Values).
                               super__Vector_base<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
          }
          uVar20._M_t.
          super___uniq_ptr_impl<llvm::DWARFContext,_std::default_delete<llvm::DWARFContext>_>._M_t.
          super__Tuple_impl<0UL,_llvm::DWARFContext_*,_std::default_delete<llvm::DWARFContext>_>.
          super__Head_base<0UL,_llvm::DWARFContext_*,_false>._M_head_impl =
               info.context._M_t.
               super___uniq_ptr_impl<llvm::DWARFContext,_std::default_delete<llvm::DWARFContext>_>.
               _M_t.
               super__Tuple_impl<0UL,_llvm::DWARFContext_*,_std::default_delete<llvm::DWARFContext>_>
               .super__Head_base<0UL,_llvm::DWARFContext_*,_false>._M_head_impl;
          if (pUVar47 != pUVar50) {
            pcVar37 = 
            "void wasm::Debug::iterContextAndYAML(const T &, U &, W) [T = llvm::iterator_range<const llvm::DWARFAbbreviationDeclaration::AttributeSpec *>, U = std::vector<llvm::DWARFYAML::FormValue>, W = (lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-debug.cpp:849:5)]"
            ;
            goto LAB_00c7cc61;
          }
        }
        info.context._M_t.
        super___uniq_ptr_impl<llvm::DWARFContext,_std::default_delete<llvm::DWARFContext>_>._M_t.
        super__Tuple_impl<0UL,_llvm::DWARFContext_*,_std::default_delete<llvm::DWARFContext>_>.
        super__Head_base<0UL,_llvm::DWARFContext_*,_false>._M_head_impl =
             uVar20._M_t.
             super___uniq_ptr_impl<llvm::DWARFContext,_std::default_delete<llvm::DWARFContext>_>.
             _M_t.
             super__Tuple_impl<0UL,_llvm::DWARFContext_*,_std::default_delete<llvm::DWARFContext>_>.
             super__Head_base<0UL,_llvm::DWARFContext_*,_false>._M_head_impl;
        pEVar32 = pEVar32 + 1;
        uVar20._M_t.
        super___uniq_ptr_impl<llvm::DWARFContext,_std::default_delete<llvm::DWARFContext>_>._M_t.
        super__Tuple_impl<0UL,_llvm::DWARFContext_*,_std::default_delete<llvm::DWARFContext>_>.
        super__Head_base<0UL,_llvm::DWARFContext_*,_false>._M_head_impl =
             info.context._M_t.
             super___uniq_ptr_impl<llvm::DWARFContext,_std::default_delete<llvm::DWARFContext>_>.
             _M_t.
             super__Tuple_impl<0UL,_llvm::DWARFContext_*,_std::default_delete<llvm::DWARFContext>_>.
             super__Head_base<0UL,_llvm::DWARFContext_*,_false>._M_head_impl;
      }
      if (pEVar32 !=
          (pUVar48->Entries).
          super__Vector_base<llvm::DWARFYAML::Entry,_std::allocator<llvm::DWARFYAML::Entry>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        pcVar37 = 
        "void wasm::Debug::iterContextAndYAML(const T &, U &, W) [T = llvm::iterator_range<__gnu_cxx::__normal_iterator<llvm::DWARFDebugInfoEntry *, std::vector<llvm::DWARFDebugInfoEntry>>>, U = std::vector<llvm::DWARFYAML::Entry>, W = (lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-debug.cpp:902:9)]"
        ;
        goto LAB_00c7cc61;
      }
      local_118 = local_118 + 1;
      pUVar48 = pUVar48 + 1;
      local_108 = local_108 + 1;
    } while (local_108 != pOVar1);
  }
  if (pUVar48 !=
      data.CompileUnits.
      super__Vector_base<llvm::DWARFYAML::Unit,_std::allocator<llvm::DWARFYAML::Unit>_>._M_impl.
      super__Vector_impl_data._M_start) {
    pcVar37 = 
    "void wasm::Debug::iterContextAndYAML(const T &, U &, W) [T = llvm::iterator_range<std::unique_ptr<llvm::DWARFUnit> *>, U = std::vector<llvm::DWARFYAML::Unit>, W = (lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-debug.cpp:889:5)]"
    ;
LAB_00c7cc61:
    __assert_fail("yamlValue == yamlList.end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-debug.cpp"
                  ,0x314,pcVar37);
  }
  if ((pointer)data.Ranges.
               super__Vector_base<llvm::DWARFYAML::Range,_std::allocator<llvm::DWARFYAML::Range>_>.
               _M_impl.super__Vector_impl_data._M_start !=
      data.ARanges.
      super__Vector_base<llvm::DWARFYAML::ARange,_std::allocator<llvm::DWARFYAML::ARange>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    lVar38 = 8;
    this_00 = &data.DebugLines.
               super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    uVar25 = 0;
    pAVar33 = data.ARanges.
              super__Vector_base<llvm::DWARFYAML::ARange,_std::allocator<llvm::DWARFYAML::ARange>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
    pRVar36 = data.Ranges.
              super__Vector_base<llvm::DWARFYAML::Range,_std::allocator<llvm::DWARFYAML::Range>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      uVar23 = *(uint *)((long)pAVar33 + lVar38 + -8);
      pUVar50 = (pointer)(ulong)uVar23;
      BVar24 = *(BinaryLocation *)((long)&(pAVar33->Length).TotalLength + lVar38);
      if ((2 < uVar23 + 2) && (2 < BVar24 + 2)) {
        uVar23 = LocationUpdater::getNewStart((LocationUpdater *)this_00,uVar23);
        this_02 = (OldToNew)this_00;
        BVar24 = LocationUpdater::getNewEnd((LocationUpdater *)this_00,BVar24);
        bVar21 = uVar23 + 2 < 3;
        bVar51 = BVar24 + 2 < 3;
        if (bVar51 || bVar21) {
          uVar23 = 0;
        }
        pUVar50 = (pointer)(ulong)uVar23;
        pAVar33 = data.ARanges.
                  super__Vector_base<llvm::DWARFYAML::ARange,_std::allocator<llvm::DWARFYAML::ARange>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pRVar36 = data.Ranges.
                  super__Vector_base<llvm::DWARFYAML::Range,_std::allocator<llvm::DWARFYAML::Range>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (bVar51 || bVar21) {
          BVar24 = 1;
        }
      }
      *(pointer *)((long)pAVar33 + lVar38 + -8) = pUVar50;
      *(ulong *)((long)&(pAVar33->Length).TotalLength + lVar38) = (ulong)BVar24;
      uVar25 = uVar25 + 1;
      lVar38 = lVar38 + 0x18;
    } while (uVar25 < (ulong)(((long)pRVar36 - (long)pAVar33 >> 3) * -0x5555555555555555));
  }
  if (data.Locs.super__Vector_base<llvm::DWARFYAML::Loc,_std::allocator<llvm::DWARFYAML::Loc>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (pointer)data.Ranges.
               super__Vector_base<llvm::DWARFYAML::Range,_std::allocator<llvm::DWARFYAML::Range>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage) {
    bVar21 = true;
    lVar38 = 0x2c;
    uVar25 = 0;
    do {
      uVar43 = (long)data.Ranges.
                     super__Vector_base<llvm::DWARFYAML::Range,_std::allocator<llvm::DWARFYAML::Range>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + uVar25 * 0x28;
      if (bVar21) {
        this_02 = LocationUpdater::getCompileUnitBasesForLoc
                            ((LocationUpdater *)
                             &data.DebugLines.
                              super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             *(size_t *)(uVar43 + 0x20));
        pUVar50 = (pointer)((ulong)this_02 >> 0x20);
      }
      iVar44 = *(int *)uVar43;
      uVar23 = *(uint *)(uVar43 + 4);
      if (iVar44 == -1) {
        uVar46 = uVar25 + 1;
        if (uVar46 < (ulong)(((long)data.Locs.
                                    super__Vector_base<llvm::DWARFYAML::Loc,_std::allocator<llvm::DWARFYAML::Loc>_>
                                    ._M_impl.super__Vector_impl_data._M_start -
                              (long)data.Ranges.
                                    super__Vector_base<llvm::DWARFYAML::Range,_std::allocator<llvm::DWARFYAML::Range>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage >> 3) *
                            -0x3333333333333333)) {
          pUVar50 = (pointer)0xffffffff;
          lVar39 = lVar38;
          llvmName.field_2._8_8_ = uVar43;
          do {
            iVar44 = *(int *)((long)data.Ranges.
                                    super__Vector_base<llvm::DWARFYAML::Range,_std::allocator<llvm::DWARFYAML::Range>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar39 + -4
                             );
            if ((iVar44 == -1) ||
               ((iVar44 + 2U < 3 &&
                (*(int *)((long)&(data.Ranges.
                                  super__Vector_base<llvm::DWARFYAML::Range,_std::allocator<llvm::DWARFYAML::Range>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage)->Start +
                         lVar39) + 2U < 3)))) break;
            BVar24 = LocationUpdater::getNewStart
                               ((LocationUpdater *)
                                &data.DebugLines.
                                 super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,iVar44 + uVar23)
            ;
            uVar22 = (uint)pUVar50;
            if (BVar24 < (uint)pUVar50) {
              uVar22 = BVar24;
            }
            if (BVar24 != 0) {
              pUVar50 = (pointer)(ulong)uVar22;
            }
            uVar46 = uVar46 + 1;
            lVar39 = lVar39 + 0x28;
          } while (uVar46 < (ulong)(((long)data.Locs.
                                           super__Vector_base<llvm::DWARFYAML::Loc,_std::allocator<llvm::DWARFYAML::Loc>_>
                                           ._M_impl.super__Vector_impl_data._M_start -
                                     (long)data.Ranges.
                                           super__Vector_base<llvm::DWARFYAML::Range,_std::allocator<llvm::DWARFYAML::Range>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage >> 3)
                                   * -0x3333333333333333));
          uVar22 = (uint)pUVar50;
          uVar43 = llvmName.field_2._8_8_;
          if (uVar22 != 0xffffffff) {
            iVar44 = -1;
            bVar21 = false;
            this_02.second = 0;
            this_02.first = uVar23;
            goto LAB_00c7c96f;
          }
        }
        iVar44 = -1;
        pUVar50 = (pointer)0x0;
        this_02.second = 0;
        this_02.first = uVar23;
        uVar22 = 0;
LAB_00c7c959:
        bVar21 = false;
      }
      else {
        bVar21 = true;
        uVar22 = uVar23;
        if (2 < iVar44 + 2U || 2 < uVar23 + 2) {
          BVar24 = LocationUpdater::getNewStart
                             ((LocationUpdater *)
                              &data.DebugLines.
                               super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              iVar44 + this_02.first);
          BVar42 = LocationUpdater::getNewEnd
                             ((LocationUpdater *)
                              &data.DebugLines.
                               super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              *(int *)(uVar43 + 4) + this_02.first);
          if (BVar24 - 1 < BVar42) {
            uVar23 = (uint)pUVar50;
            iVar44 = BVar24 - uVar23;
            if ((BVar24 < uVar23) || (uVar22 = BVar42 - uVar23, BVar42 < uVar23)) {
              __assert_fail("newStart >= newBase && newEnd >= newBase",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-debug.cpp"
                            ,0x40d,
                            "void wasm::Debug::updateLoc(llvm::DWARFYAML::Data &, const LocationUpdater &)"
                           );
            }
            if (uVar22 == 0 && iVar44 == 0) {
              iVar44 = 1;
              uVar22 = 1;
            }
            goto LAB_00c7c959;
          }
          iVar44 = 1;
          bVar21 = false;
          uVar22 = 1;
        }
      }
LAB_00c7c96f:
      *(int *)uVar43 = iVar44;
      *(uint *)(uVar43 + 4) = uVar22;
      uVar25 = uVar25 + 1;
      lVar38 = lVar38 + 0x28;
    } while (uVar25 < (ulong)(((long)data.Locs.
                                     super__Vector_base<llvm::DWARFYAML::Loc,_std::allocator<llvm::DWARFYAML::Loc>_>
                                     ._M_impl.super__Vector_impl_data._M_start -
                               (long)data.Ranges.
                                     super__Vector_base<llvm::DWARFYAML::Range,_std::allocator<llvm::DWARFYAML::Range>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage >> 3) *
                             -0x3333333333333333));
  }
  pRVar36 = data.Ranges.
            super__Vector_base<llvm::DWARFYAML::Range,_std::allocator<llvm::DWARFYAML::Range>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage;
  llvm::DWARFYAML::EmitDebugSections
            ((StringMap<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_llvm::MallocAllocator>
              *)&locationUpdater.compileUnitBases._M_h._M_single_bucket,(Data *)local_658,false);
  pCVar13 = (wasm->customSections).
            super__Vector_base<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (pCVar40 = (wasm->customSections).
                 super__Vector_base<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>.
                 _M_impl.super__Vector_impl_data._M_start; pCVar40 != pCVar13; pCVar40 = pCVar40 + 1
      ) {
    s._M_str = (char *)0x0;
    s._M_len = (size_t)(pCVar40->name)._M_dataplus._M_p;
    _auStack_58 = (StringRef)
                  IString::interned((IString *)(pCVar40->name)._M_string_length,s,SUB81(pRVar36,0));
    bVar21 = IString::startsWith<8>((IString *)auStack_58,(char (*) [8])".debug_");
    if (bVar21) {
      pRVar36 = (pointer)0xffffffffffffffff;
      std::__cxx11::string::substr((ulong)auStack_58,(ulong)pCVar40);
      iVar44 = llvm::StringMapImpl::FindKey
                         ((StringMapImpl *)&locationUpdater.compileUnitBases._M_h._M_single_bucket,
                          _auStack_58);
      if ((iVar44 != -1) &&
         (pRVar36 = (pointer)((ulong)newSections.super_StringMapImpl.TheTable & 0xffffffff),
         (pointer)(long)iVar44 != pRVar36)) {
        pVar53 = llvm::
                 StringMap<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_llvm::MallocAllocator>
                 ::try_emplace<>((StringMap<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_llvm::MallocAllocator>
                                  *)&locationUpdater.compileUnitBases._M_h._M_single_bucket,
                                 _auStack_58);
        lVar38 = *(long *)(*(long *)pVar53.first.
                                    super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>,_llvm::StringMapEntry<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>_>
                                    .Ptr.
                                    super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>,_llvm::StringMapEntry<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>_>
                          + 8);
        pvVar12 = *(void **)(lVar38 + 8);
        pvVar14 = *(void **)(lVar38 + 0x10);
        __new_size = (long)pvVar14 - (long)pvVar12;
        std::vector<char,_std::allocator<char>_>::resize(&pCVar40->data,__new_size);
        if (pvVar14 != pvVar12) {
          memmove((pCVar40->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start,pvVar12,__new_size);
        }
      }
      if (auStack_58 != (undefined1  [8])&llvmName._M_string_length) {
        operator_delete((void *)auStack_58,llvmName._M_string_length + 1);
      }
    }
  }
  llvm::
  StringMap<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_llvm::MallocAllocator>
  ::~StringMap((StringMap<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_llvm::MallocAllocator>
                *)&locationUpdater.compileUnitBases._M_h._M_single_bucket);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&locationUpdater.debugLineMap._M_h._M_single_bucket);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&locationUpdater.locToUnitMap._M_h._M_single_bucket);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&locationUpdater.oldFuncAddrMap.endMap._M_h._M_single_bucket);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<const_unsigned_int,_wasm::Function_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<const_unsigned_int,_wasm::Function_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&locationUpdater.oldFuncAddrMap.startMap._M_h._M_single_bucket);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<const_unsigned_int,_wasm::Function_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<const_unsigned_int,_wasm::Function_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&locationUpdater.oldExprAddrMap.delimiterMap._M_h._M_single_bucket);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Debug::AddrExprMap::DelimiterInfo>,_std::allocator<std::pair<const_unsigned_int,_wasm::Debug::AddrExprMap::DelimiterInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Debug::AddrExprMap::DelimiterInfo>,_std::allocator<std::pair<const_unsigned_int,_wasm::Debug::AddrExprMap::DelimiterInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&locationUpdater.oldExprAddrMap.endMap._M_h._M_single_bucket);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Expression_*>,_std::allocator<std::pair<const_unsigned_int,_wasm::Expression_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Expression_*>,_std::allocator<std::pair<const_unsigned_int,_wasm::Expression_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&locationUpdater.oldExprAddrMap.startMap._M_h._M_single_bucket);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Expression_*>,_std::allocator<std::pair<const_unsigned_int,_wasm::Expression_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Expression_*>,_std::allocator<std::pair<const_unsigned_int,_wasm::Expression_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&locationUpdater.newLocations);
  llvm::DWARFYAML::Data::~Data((Data *)local_658);
  if (info.sections._24_8_ != 0) {
    (**(code **)(*(long *)info.sections._24_8_ + 8))();
  }
  info.sections._24_8_ = 0;
  llvm::
  StringMap<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_llvm::MallocAllocator>
  ::~StringMap((StringMap<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_llvm::MallocAllocator>
                *)local_168);
  return;
LAB_00c7bde8:
  p_Var9 = p_Var9->_M_nxt;
  if ((p_Var9 == (_Hash_node_base *)0x0) ||
     (uVar23 = *(uint *)&p_Var9[1]._M_nxt,
     (ulong)uVar23 % (ulong)locationUpdater.oldExprAddrMap.endMap._M_h._M_buckets !=
     uVar25 % (ulong)locationUpdater.oldExprAddrMap.endMap._M_h._M_buckets)) goto LAB_00c7bf33;
  goto joined_r0x00c7bde6;
}

Assistant:

void writeDWARFSections(Module& wasm, const BinaryLocations& newLocations) {
  BinaryenDWARFInfo info(wasm);

  // Convert to Data representation, which YAML can use to write.
  llvm::DWARFYAML::Data data;
  if (dwarf2yaml(*info.context, data)) {
    Fatal() << "Failed to parse DWARF to YAML";
  }

  LocationUpdater locationUpdater(wasm, newLocations);

  updateDebugLines(data, locationUpdater);

  bool is64 = wasm.memories.size() > 0 ? wasm.memories[0]->is64() : false;
  updateCompileUnits(info, data, locationUpdater, is64);

  updateRanges(data, locationUpdater);

  updateLoc(data, locationUpdater);

  // Convert to binary sections.
  auto newSections =
    EmitDebugSections(data, false /* EmitFixups for debug_info */);

  // Update the custom sections in the wasm.
  // TODO: efficiency
  for (auto& section : wasm.customSections) {
    if (Name(section.name).startsWith(".debug_")) {
      auto llvmName = section.name.substr(1);
      if (newSections.count(llvmName)) {
        auto llvmData = newSections[llvmName]->getBuffer();
        section.data.resize(llvmData.size());
        std::copy(llvmData.begin(), llvmData.end(), section.data.data());
      }
    }
  }
}